

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoaderDriver.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  Map *pMVar2;
  AlternativeLoader *this;
  MapLoaderAdapter *this_00;
  undefined4 extraout_var;
  MapLoader myLoader;
  string MAP2;
  string MAP3;
  string MAP1;
  MapLoader local_e0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"debugValid.map","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_48 + (long)local_50);
  MapLoader::MapLoader(&local_e0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"creating map 1 (valid)\n",0x17);
  pMVar2 = MapLoader::readMapFile(&local_e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nmap 1 creation completed.\n",0x1b);
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"world2Invalid.map","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_c8 + (long)local_d0);
  MapLoader::setMapFile(&local_e0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ncreating map 2 (invalid)\n",0x1a);
  pMVar2 = MapLoader::readMapFile(&local_e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"map 2 creation attempt completed.\n",0x22);
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"africa.map","");
  this = (AlternativeLoader *)operator_new(8);
  AlternativeLoader::AlternativeLoader(this,&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"creating map 3 using alternative loader directly (valid)\n",0x39
            );
  pMVar2 = AlternativeLoader::altReadMapFile(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nmap 3 creation completed.\n",0x1b);
  if (pMVar2 != (Map *)0x0) {
    Map::printMap(pMVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"creating map 4 using adapter (valid)\n",0x25);
  this_00 = (MapLoaderAdapter *)operator_new(0x18);
  MapLoaderAdapter::MapLoaderAdapter(this_00,this);
  iVar1 = (*(this_00->super_MapLoader)._vptr_MapLoader[2])(this_00);
  if ((Map *)CONCAT44(extraout_var,iVar1) != (Map *)0x0) {
    Map::printMap((Map *)CONCAT44(extraout_var,iVar1));
  }
  (*(this_00->super_MapLoader)._vptr_MapLoader[1])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  MapLoader::~MapLoader(&local_e0);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    //init loader
    const std::string MAP1 = "debugValid.map";
    MapLoader myLoader = MapLoader(MAP1);

    //create first (valid) map
    std::cout << "creating map 1 (valid)\n";
    Map* firstMap = myLoader.readMapFile();
    std::cout << "\nmap 1 creation completed.\n";
    if (firstMap) {
        firstMap->printMap();
    }
    
    //create second (invalid) map
    /*
     * this map is invalid in many ways. Alaska is assigned to a continent
     * that doesnt exist, alberta has a wrong country ID and it is not a
     * connected graph (that can be tested for in Map.cpp).
     */
    std::cout << "\n\n";
    const std::string MAP2 = "world2Invalid.map";
    myLoader.setMapFile(MAP2);
    std::cout << "\ncreating map 2 (invalid)\n";
    Map* secondMap = myLoader.readMapFile();
    std::cout << "map 2 creation attempt completed.\n";
    if (secondMap) {
        secondMap->printMap();
    }

    //init alternative loader
    std::cout << "\n\n";
    const std::string MAP3 = "africa.map";
    auto* altLoader = new AlternativeLoader(MAP3);

    std::cout << "creating map 3 using alternative loader directly (valid)\n";
    Map* thirdMap = altLoader->altReadMapFile();
    std::cout << "\nmap 3 creation completed.\n";
    if (thirdMap) {
        thirdMap->printMap();
    }

    //init adapter
    std::cout << "\n\n";
    std::cout << "creating map 4 using adapter (valid)\n";
    auto* adapter = new MapLoaderAdapter(altLoader);
    Map* fourthMap = adapter->readMapFile();
    if (fourthMap) {
        fourthMap->printMap();
    }

    delete(adapter);

    return 0;
}